

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createAlloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  long lVar1;
  Value *V;
  bool bVar2;
  uint uVar3;
  RWNode *pRVar4;
  long lVar5;
  Instruction *pIVar6;
  DataLayout *DL;
  GenericDefSite<dg::dda::RWNode> local_48;
  
  pRVar4 = ReadWriteGraph::create(&this->graph,ALLOC);
  lVar1 = *(long *)(Inst + 8);
  do {
    if (lVar1 == 0) {
LAB_001105ea:
      if ((Inst != (Instruction *)0x0) && (Inst[0x10] == (Instruction)0x3a)) {
        DL = (DataLayout *)llvm::Module::getDataLayout();
        local_48.len.offset = llvmutils::getAllocatedSize((AllocaInst *)Inst,DL);
        (pRVar4->super_SubgraphNode<dg::dda::RWNode>).size = local_48.len.offset;
        if (pRVar4->has_address_taken == false) {
          if (local_48.len.offset == 0) {
            local_48.len.offset = Offset::UNKNOWN;
          }
          local_48.offset.offset = 0;
          local_48.target = pRVar4;
          std::
          _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
          ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
                    ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
                      *)&(pRVar4->annotations).overwrites,&local_48);
        }
      }
      return pRVar4;
    }
    V = *(Value **)(lVar1 + 0x18);
    if ((V == (Value *)0x0) || (V[0x10] != (Value)0x3c)) {
      bVar2 = llvm::MemIntrinsic::classof(V);
      if (bVar2) {
        lVar5 = *(long *)(V + -0x20);
        if (*(long *)(lVar5 + 0x18) != *(long *)(V + 0x48)) {
          lVar5 = 0;
        }
        uVar3 = *(int *)(lVar5 + 0x24) - 0xbf;
        if (uVar3 < 6) {
          pIVar6 = (Instruction *)0x0;
          if ((0x29U >> (uVar3 & 0x1f) & 1) != 0) {
            pIVar6 = *(Instruction **)(V + (0x20 - (ulong)(uint)(*(int *)(V + 0x14) << 5)));
          }
        }
        else {
          pIVar6 = (Instruction *)0x0;
        }
        goto joined_r0x001105d2;
      }
    }
    else {
      pIVar6 = *(Instruction **)(V + -0x40);
joined_r0x001105d2:
      if (pIVar6 == Inst) {
        pRVar4->has_address_taken = true;
        goto LAB_001105ea;
      }
    }
    lVar1 = *(long *)(lVar1 + 8);
  } while( true );
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    using namespace llvm;

    RWNode &node = create(RWNodeType::ALLOC);

    // check if the address of this alloca is taken
    for (auto I = Inst->use_begin(), E = Inst->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        auto *use = *I;
#else
        auto *use = I->getUser();
#endif
        if (auto *S = dyn_cast<StoreInst>(use)) {
            if (S->getValueOperand() == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (auto *MI = dyn_cast<MemIntrinsic>(use)) {
            if (getMemIntrinsicValueOp(MI) == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (const auto *I = dyn_cast<Instruction>(Inst)) {
            assert(!I->mayWriteToMemory() &&
                   "Unhandled memory-writing instruction");
            (void) I; // c++17 TODO: replace with [[maybe_unused]]
        }
    }

    if (const AllocaInst *AI = dyn_cast<AllocaInst>(Inst)) {
        auto size = llvmutils::getAllocatedSize(AI, getDataLayout());
        node.setSize(size);
        // this is a alloca that does not have the address taken,
        // therefore we must always access the last instance in loads
        // (even in recursive functions) and may terminate the search
        // for definitions of this alloca at this alloca
        if (!node.hasAddressTaken()) {
            node.addOverwrites(&node, 0, size > 0 ? size : Offset::UNKNOWN);
        }
    }
    return &node;
}